

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

bool32 rw::Engine::start(void)

{
  FILE *__stream;
  char *pcVar1;
  bool32 bVar2;
  PluginList *this;
  uint i;
  long lVar3;
  Error _e;
  
  if ((engine == (void *)0x0) || (state != 2)) {
    _e.plugin = 0;
    _e.code = 0x80000009;
    bVar2 = 0;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/engine.cpp"
            ,300);
    __stream = _stderr;
    pcVar1 = dbgsprint(0x80000009);
    fprintf(__stream,"%s\n",pcVar1);
    setError(&_e);
  }
  else {
    (**(code **)((long)engine + 0x108))(0,0,0);
    PluginList::construct((PluginList *)&s_plglist,engine);
    this = (PluginList *)&Driver::s_plglist;
    for (lVar3 = 0; lVar3 != 0xd; lVar3 = lVar3 + 1) {
      PluginList::construct(this,*(void **)((long)engine + lVar3 * 8 + 0x20));
      this = this + 1;
    }
    (**(code **)((long)engine + 0x108))(4,0,0);
    Image::registerFileFormat("tga",readTGA,writeTGA);
    Image::registerFileFormat("bmp",readBMP,writeBMP);
    Image::registerFileFormat("png",readPNG,writePNG);
    state = 3;
    bVar2 = 1;
  }
  return bVar2;
}

Assistant:

bool32
Engine::start(void)
{
	if(engine == nil || Engine::state != Opened){
		RWERROR((ERR_ENGINESTART));
		return 0;
	}

	engine->device.system(DEVICEINIT, nil, 0);

	Engine::s_plglist.construct(engine);
	for(uint i = 0; i < NUM_PLATFORMS; i++)
		Driver::s_plglist[i].construct(rw::engine->driver[i]);

	engine->device.system(DEVICEFINALIZE, nil, 0);

	// Register some image formats. Or should we leave that to the user?
	Image::registerFileFormat("tga", readTGA, writeTGA);
	Image::registerFileFormat("bmp", readBMP, writeBMP);
	Image::registerFileFormat("png", readPNG, writePNG);

	Engine::state = Started;
	return 1;
}